

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O3

int imagetotif(opj_image_t *image,char *outfile)

{
  OPJ_UINT32 OVar1;
  opj_image_comp_t *poVar2;
  convert_32s_PXCX p_Var3;
  opj_image_comp_t *poVar4;
  long lVar5;
  size_t __size;
  OPJ_BYTE *pOVar6;
  OPJ_INT32 *pOVar7;
  code *pcVar8;
  ulong uVar9;
  uint uVar10;
  OPJ_INT32 OVar11;
  ulong uVar12;
  undefined4 uVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  OPJ_INT32 *planes [4];
  OPJ_INT32 *local_58;
  long local_50 [4];
  
  poVar2 = image->comps;
  uVar16 = poVar2->prec;
  local_58 = poVar2->data;
  uVar15 = image->numcomps;
  if (image->color_space == OPJ_CLRSPC_CMYK) {
    if (uVar15 < 4) {
      imagetotif_cold_6();
      return 1;
    }
    uVar13 = 5;
    uVar9 = 4;
  }
  else if (uVar15 < 3) {
    uVar13 = 1;
    uVar9 = 2;
    uVar12 = 1;
    if (uVar15 != 2) {
LAB_0010fa60:
      if ((uint)uVar12 != uVar15) {
        imagetotif_cold_1();
        return 1;
      }
      goto LAB_0010fa69;
    }
  }
  else {
    uVar9 = 4;
    if (uVar15 < 4) {
      uVar9 = (ulong)uVar15;
    }
    uVar13 = 2;
  }
  uVar15 = (uint)uVar9;
  OVar1 = poVar2->dx;
  uVar12 = 1;
  poVar4 = poVar2;
  do {
    if ((((OVar1 != poVar4[1].dx) || (poVar2->dy != poVar4[1].dy)) || (uVar16 != poVar4[1].prec)) ||
       (poVar2->sgnd != poVar4[1].sgnd)) goto LAB_0010fa60;
    pOVar7 = poVar4[1].data;
    local_50[uVar12 - 1] = (long)pOVar7;
    if (pOVar7 == (OPJ_INT32 *)0x0) {
      imagetotif_cold_5();
      return 1;
    }
    uVar12 = uVar12 + 1;
    poVar4 = poVar4 + 1;
  } while (uVar9 != uVar12);
LAB_0010fa69:
  uVar10 = 0;
  if ((uVar16 & 0xffff) < 0x11) {
    uVar10 = uVar16;
  }
  if ((short)uVar10 == 0) {
    imagetotif_cold_4();
  }
  else {
    lVar5 = TIFFOpen();
    if (lVar5 == 0) {
      fprintf(_stderr,"imagetotif:failed to open %s for writing\n",outfile);
    }
    else {
      uVar10 = uVar10 & 0xffff;
      if (uVar15 == 0) {
        uVar9 = 0;
      }
      else {
        uVar9 = (ulong)uVar15;
        lVar14 = 0;
        do {
          clip_component((opj_image_comp_t *)((long)&image->comps->dx + lVar14),image->comps->prec);
          lVar14 = lVar14 + 0x40;
        } while (uVar9 << 6 != lVar14);
      }
      OVar11 = 0;
      switch(uVar10) {
      case 1:
      case 2:
      case 4:
      case 6:
      case 8:
        pcVar8 = convert_32sXXu_C1R_LUT[uVar10];
        break;
      case 3:
        pcVar8 = tif_32sto3u;
        break;
      case 5:
        pcVar8 = tif_32sto5u;
        break;
      case 7:
        pcVar8 = tif_32sto7u;
        break;
      case 9:
        pcVar8 = tif_32sto9u;
        break;
      case 10:
        pcVar8 = tif_32sto10u;
        break;
      case 0xb:
        pcVar8 = tif_32sto11u;
        break;
      case 0xc:
        pcVar8 = tif_32sto12u;
        break;
      case 0xd:
        pcVar8 = tif_32sto13u;
        break;
      case 0xe:
        pcVar8 = tif_32sto14u;
        break;
      case 0xf:
        pcVar8 = tif_32sto15u;
        break;
      case 0x10:
        pcVar8 = tif_32sto16u;
        break;
      default:
        pcVar8 = (convert_32sXXx_C1R)0x0;
      }
      poVar2 = image->comps;
      if (poVar2->sgnd != 0) {
        OVar11 = 1 << ((char)poVar2->prec - 1U & 0x1f);
      }
      p_Var3 = convert_32s_PXCX_LUT[uVar9];
      uVar16 = poVar2->w;
      uVar12 = (ulong)uVar16;
      OVar1 = poVar2->h;
      TIFFSetField(lVar5,0x100,uVar12);
      TIFFSetField(lVar5,0x101,OVar1);
      TIFFSetField(lVar5,0x115,uVar15);
      TIFFSetField(lVar5,0x102,uVar10);
      TIFFSetField(lVar5,0x112,1);
      TIFFSetField(lVar5,0x11c,1);
      TIFFSetField(lVar5,0x106,uVar13);
      TIFFSetField(lVar5,0x116,1);
      __size = TIFFStripSize(lVar5);
      if ((int)(uVar15 * uVar12 >> 0x20) == 0) {
        uVar15 = uVar15 * uVar16;
        if ((uVar15 < 0x40000000) && ((int)((ulong)uVar10 * (ulong)uVar15 >> 0x20) == 0)) {
          if (__size != uVar15 * uVar10 + 7 >> 3) {
            imagetotif_cold_2();
            return 1;
          }
          pOVar6 = (OPJ_BYTE *)malloc(__size);
          if (pOVar6 != (OPJ_BYTE *)0x0) {
            pOVar7 = (OPJ_INT32 *)malloc(uVar9 * uVar12 * 4);
            if (pOVar7 != (OPJ_INT32 *)0x0) {
              if (image->comps->h != 0) {
                uVar16 = 0;
                lVar14 = uVar12 * 4;
                do {
                  (*p_Var3)(&local_58,pOVar7,uVar12,OVar11);
                  (*pcVar8)(pOVar7,pOVar6,uVar9 * uVar12);
                  TIFFWriteEncodedStrip(lVar5,uVar16,pOVar6,__size);
                  local_58 = local_58 + uVar12;
                  local_50[0] = local_50[0] + lVar14;
                  local_50[1] = local_50[1] + lVar14;
                  local_50[2] = local_50[2] + lVar14;
                  uVar16 = uVar16 + 1;
                } while (uVar16 < image->comps->h);
              }
              _TIFFfree(pOVar6);
              TIFFClose(lVar5);
              free(pOVar7);
              return 0;
            }
            _TIFFfree(pOVar6);
          }
          TIFFClose(lVar5);
          return 1;
        }
      }
      imagetotif_cold_3();
    }
  }
  return 1;
}

Assistant:

int imagetotif(opj_image_t * image, const char *outfile)
{
    TIFF *tif;
    tdata_t buf;
    uint32_t width, height;
    uint16_t bps, tiPhoto;
    int adjust, sgnd;
    int64_t strip_size, rowStride, TIFF_MAX;
    OPJ_UINT32 i, numcomps;
    OPJ_INT32* buffer32s = NULL;
    OPJ_INT32 const* planes[4];
    convert_32s_PXCX cvtPxToCx = NULL;
    convert_32sXXx_C1R cvt32sToTif = NULL;

    bps = (uint16_t)image->comps[0].prec;
    planes[0] = image->comps[0].data;

    numcomps = image->numcomps;

    if (image->color_space == OPJ_CLRSPC_CMYK) {
        if (numcomps < 4U) {
            fprintf(stderr,
                    "imagetotif: CMYK images shall be composed of at least 4 planes.\n");
            fprintf(stderr, "\tAborting\n");
            return 1;
        }
        tiPhoto = PHOTOMETRIC_SEPARATED;
        if (numcomps > 4U) {
            numcomps = 4U; /* Alpha not supported */
        }
    } else if (numcomps > 2U) {
        tiPhoto = PHOTOMETRIC_RGB;
        if (numcomps > 4U) {
            numcomps = 4U;
        }
    } else {
        tiPhoto = PHOTOMETRIC_MINISBLACK;
    }
    for (i = 1U; i < numcomps; ++i) {
        if (image->comps[0].dx != image->comps[i].dx) {
            break;
        }
        if (image->comps[0].dy != image->comps[i].dy) {
            break;
        }
        if (image->comps[0].prec != image->comps[i].prec) {
            break;
        }
        if (image->comps[0].sgnd != image->comps[i].sgnd) {
            break;
        }
        planes[i] = image->comps[i].data;
        if (planes[i] == NULL) {
            fprintf(stderr,
                    "imagetotif: planes[%d] == NULL.\n", i);
            fprintf(stderr, "\tAborting\n");
            return 1;
        }
    }
    if (i != numcomps) {
        fprintf(stderr,
                "imagetotif: All components shall have the same subsampling, same bit depth.\n");
        fprintf(stderr, "\tAborting\n");
        return 1;
    }

    if (bps > 16) {
        bps = 0;
    }
    if (bps == 0) {
        fprintf(stderr, "imagetotif: Bits=%d, Only 1 to 16 bits implemented\n", bps);
        fprintf(stderr, "\tAborting\n");
        return 1;
    }
    tif = TIFFOpen(outfile, "wb");
    if (!tif) {
        fprintf(stderr, "imagetotif:failed to open %s for writing\n", outfile);
        return 1;
    }
    for (i = 0U; i < numcomps; ++i) {
        clip_component(&(image->comps[i]), image->comps[0].prec);
    }
    cvtPxToCx = convert_32s_PXCX_LUT[numcomps];
    switch (bps) {
    case 1:
    case 2:
    case 4:
    case 6:
    case 8:
        cvt32sToTif = convert_32sXXu_C1R_LUT[bps];
        break;
    case 3:
        cvt32sToTif = tif_32sto3u;
        break;
    case 5:
        cvt32sToTif = tif_32sto5u;
        break;
    case 7:
        cvt32sToTif = tif_32sto7u;
        break;
    case 9:
        cvt32sToTif = tif_32sto9u;
        break;
    case 10:
        cvt32sToTif = tif_32sto10u;
        break;
    case 11:
        cvt32sToTif = tif_32sto11u;
        break;
    case 12:
        cvt32sToTif = tif_32sto12u;
        break;
    case 13:
        cvt32sToTif = tif_32sto13u;
        break;
    case 14:
        cvt32sToTif = tif_32sto14u;
        break;
    case 15:
        cvt32sToTif = tif_32sto15u;
        break;
    case 16:
        cvt32sToTif = (convert_32sXXx_C1R)tif_32sto16u;
        break;
    default:
        /* never here */
        break;
    }
    sgnd = (int)image->comps[0].sgnd;
    adjust = sgnd ? (int)(1 << (image->comps[0].prec - 1)) : 0;
    width   = (uint32_t)image->comps[0].w;
    height  = (uint32_t)image->comps[0].h;

    TIFFSetField(tif, TIFFTAG_IMAGEWIDTH, width);
    TIFFSetField(tif, TIFFTAG_IMAGELENGTH, height);
    TIFFSetField(tif, TIFFTAG_SAMPLESPERPIXEL, (uint16_t)numcomps);
    TIFFSetField(tif, TIFFTAG_BITSPERSAMPLE, bps);
    TIFFSetField(tif, TIFFTAG_ORIENTATION, ORIENTATION_TOPLEFT);
    TIFFSetField(tif, TIFFTAG_PLANARCONFIG, PLANARCONFIG_CONTIG);
    TIFFSetField(tif, TIFFTAG_PHOTOMETRIC, tiPhoto);
    TIFFSetField(tif, TIFFTAG_ROWSPERSTRIP, 1);
    if (sizeof(tsize_t) == 4) {
        TIFF_MAX = INT_MAX;
    } else {
        TIFF_MAX = UINT_MAX;
    }
    strip_size = (int64_t)TIFFStripSize(tif);

    if ((int64_t)width > (int64_t)(TIFF_MAX / numcomps) ||
            (int64_t)(width * numcomps) > (int64_t)(TIFF_MAX / bps) ||
            (int64_t)(width * numcomps) > (int64_t)(TIFF_MAX / (int64_t)sizeof(
                        OPJ_INT32))) {
        fprintf(stderr, "Buffer overflow\n");
        TIFFClose(tif);
        return 1;
    }
    rowStride = (int64_t)((width * numcomps * bps + 7U) / 8U);
    if (rowStride != strip_size) {
        fprintf(stderr, "Invalid TIFF strip size\n");
        TIFFClose(tif);
        return 1;
    }
    buf = malloc((OPJ_SIZE_T)strip_size);
    if (buf == NULL) {
        TIFFClose(tif);
        return 1;
    }
    buffer32s = (OPJ_INT32 *)malloc(sizeof(OPJ_INT32) * width * numcomps);
    if (buffer32s == NULL) {
        _TIFFfree(buf);
        TIFFClose(tif);
        return 1;
    }

    for (i = 0; i < image->comps[0].h; ++i) {
        cvtPxToCx(planes, buffer32s, (OPJ_SIZE_T)width, adjust);
        cvt32sToTif(buffer32s, (OPJ_BYTE *)buf, (OPJ_SIZE_T)width * numcomps);
        (void)TIFFWriteEncodedStrip(tif, i, (void*)buf, (tsize_t)strip_size);
        planes[0] += width;
        planes[1] += width;
        planes[2] += width;
        planes[3] += width;
    }
    _TIFFfree((void*)buf);
    TIFFClose(tif);
    free(buffer32s);

    return 0;
}